

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenAtomicStore(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,
                   BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
                   char *memoryName)

{
  BinaryenType value_00;
  BinaryenExpressionRef ptr_00;
  uint bytes_00;
  Store *pSVar1;
  Name memory;
  Type local_48;
  Address local_40;
  Builder local_38;
  BinaryenType local_30;
  BinaryenType type_local;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef ptr_local;
  uint32_t offset_local;
  uint32_t bytes_local;
  BinaryenModuleRef module_local;
  
  local_30 = type;
  type_local = (BinaryenType)value;
  value_local = ptr;
  ptr_local._0_4_ = offset;
  ptr_local._4_4_ = bytes;
  _offset_local = module;
  wasm::Builder::Builder(&local_38,module);
  bytes_00 = ptr_local._4_4_;
  wasm::Address::Address(&local_40,(ulong)(uint32_t)ptr_local);
  ptr_00 = value_local;
  value_00 = type_local;
  wasm::Type::Type(&local_48,local_30);
  memory = getMemoryName(_offset_local,memoryName);
  pSVar1 = wasm::Builder::makeAtomicStore
                     (&local_38,bytes_00,local_40,ptr_00,(Expression *)value_00,local_48,memory);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicStore(BinaryenModuleRef module,
                                          uint32_t bytes,
                                          uint32_t offset,
                                          BinaryenExpressionRef ptr,
                                          BinaryenExpressionRef value,
                                          BinaryenType type,
                                          const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicStore(bytes,
                       offset,
                       (Expression*)ptr,
                       (Expression*)value,
                       Type(type),
                       getMemoryName(module, memoryName)));
}